

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::sink_it_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this,log_msg *msg)

{
  pointer pfVar1;
  time_point in_RCX;
  void *__buf;
  long in_RSI;
  long in_RDI;
  memory_buf_t formatted;
  filename_t filename;
  bool should_rotate;
  time_point time;
  allocator<char> *in_stack_fffffffffffffe08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe10;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *this_00;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_fffffffffffffe18;
  undefined1 local_1b8 [32];
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_fffffffffffffe68;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_fffffffffffffeb0;
  tm *in_stack_ffffffffffffff08;
  filename_t *in_stack_ffffffffffffff10;
  string local_40 [39];
  byte local_19;
  undefined8 local_18;
  long local_10;
  
  local_18 = *(undefined8 *)(in_RSI + 0x18);
  local_10 = in_RSI;
  local_19 = std::chrono::operator>=
                       (in_stack_fffffffffffffe10,
                        (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffe08);
  if ((bool)local_19) {
    now_tm(in_stack_fffffffffffffe18,(time_point)(in_RDI + 0x40));
    daily_filename_calculator::calc_filename(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    details::file_helper::open
              ((file_helper *)(in_RDI + 0x70),(char *)local_40,*(byte *)(in_RDI + 0x120) & 1);
    in_RCX = next_rotation_tp_(in_stack_fffffffffffffe68);
    ((duration *)(in_RDI + 0x68))->__r = (rep)in_RCX.__d.__r;
    std::__cxx11::string::~string(local_40);
  }
  this_00 = (basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)local_1b8;
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(this_00,in_stack_fffffffffffffe08);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x12216f);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,this_00);
  details::file_helper::write
            ((file_helper *)(in_RDI + 0x70),(int)local_1b8,__buf,(size_t)in_RCX.__d.__r);
  if (((local_19 & 1) != 0) && (*(short *)(in_RDI + 0x122) != 0)) {
    delete_old_(in_stack_fffffffffffffeb0);
  }
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x1221f2);
  return;
}

Assistant:

void sink_it_(const details::log_msg &msg) override {
        auto time = msg.time;
        bool should_rotate = time >= rotation_tp_;
        if (should_rotate) {
            auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(time));
            file_helper_.open(filename, truncate_);
            rotation_tp_ = next_rotation_tp_();
        }
        memory_buf_t formatted;
        base_sink<Mutex>::formatter_->format(msg, formatted);
        file_helper_.write(formatted);

        // Do the cleaning only at the end because it might throw on failure.
        if (should_rotate && max_files_ > 0) {
            delete_old_();
        }
    }